

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

PersistentColumnData * __thiscall
duckdb::StructColumnCheckpointState::ToPersistentData
          (PersistentColumnData *__return_storage_ptr__,StructColumnCheckpointState *this)

{
  pointer puVar1;
  pointer pCVar2;
  unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
  *child_state;
  pointer this_00;
  PersistentColumnData PStack_68;
  
  PersistentColumnData::PersistentColumnData(__return_storage_ptr__,STRUCT);
  pCVar2 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->(&this->validity_state);
  (*pCVar2->_vptr_ColumnCheckpointState[5])(&PStack_68,pCVar2);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&PStack_68);
  PersistentColumnData::~PersistentColumnData(&PStack_68);
  puVar1 = (this->child_states).
           super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->child_states).
                 super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pCVar2 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
             ::operator->(this_00);
    (*pCVar2->_vptr_ColumnCheckpointState[5])(&PStack_68,pCVar2);
    ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
    emplace_back<duckdb::PersistentColumnData>
              (&(__return_storage_ptr__->child_columns).
                super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
               ,&PStack_68);
    PersistentColumnData::~PersistentColumnData(&PStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData ToPersistentData() override {
		PersistentColumnData data(PhysicalType::STRUCT);
		data.child_columns.push_back(validity_state->ToPersistentData());
		for (auto &child_state : child_states) {
			data.child_columns.push_back(child_state->ToPersistentData());
		}
		return data;
	}